

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

long lsh::vector::random(void)

{
  result_type_conflict1 rVar1;
  result_type rVar2;
  uint in_ESI;
  vector *in_RDI;
  reference rVar3;
  reference local_2780;
  uint local_2770;
  allocator<bool> local_2769;
  uint i;
  vector<bool,_std::allocator<bool>_> c;
  uniform_int_distribution<int> components;
  undefined1 local_2728 [8];
  mt19937 generator;
  random_device random;
  uint d_local;
  
  std::random_device::random_device((random_device *)&generator._M_p);
  rVar1 = std::random_device::operator()((random_device *)&generator._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2728,(ulong)rVar1);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)
             ((long)&c.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                     _M_end_of_storage + 4),0,1);
  std::allocator<bool>::allocator(&local_2769);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&i,(ulong)in_ESI,&local_2769);
  std::allocator<bool>::~allocator(&local_2769);
  for (local_2770 = 0; local_2770 < in_ESI; local_2770 = local_2770 + 1) {
    rVar2 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)
                       ((long)&c.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_end_of_storage + 4),
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)local_2728);
    rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)&i,(ulong)local_2770);
    local_2780 = rVar3;
    std::_Bit_reference::operator=(&local_2780,rVar2 != 0);
  }
  vector(in_RDI,(vector<bool,_std::allocator<bool>_> *)&i);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)&i);
  std::random_device::~random_device((random_device *)&generator._M_p);
  return (long)in_RDI;
}

Assistant:

vector vector::random(unsigned int d) {
    std::random_device random;
    std::mt19937 generator(random());
    std::uniform_int_distribution<> components(0, 1);

    std::vector<bool> c(d);

    for (unsigned int i = 0; i < d; i++) {
      c[i] = components(generator);
    }

    return vector(c);
  }